

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

int nni_copyin_int(int *ip,void *v,size_t sz,int minv,int maxv,nni_type t)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0x1e;
  if (t == NNI_TYPE_INT32) {
    iVar1 = *v;
    iVar2 = 3;
    if (minv <= iVar1 && iVar1 <= maxv) {
      *ip = iVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
nni_copyin_int(
    int *ip, const void *v, size_t sz, int minv, int maxv, nni_type t)
{
	int i;
	NNI_ARG_UNUSED(sz);

	if (t != NNI_TYPE_INT32) {
		return (NNG_EBADTYPE);
	}
	i = *(int *) v;
	if (i > maxv) {
		return (NNG_EINVAL);
	}
	if (i < minv) {
		return (NNG_EINVAL);
	}
	*ip = i;
	return (0);
}